

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Malloc(u64 n)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  sqlite3StatValueType newValue;
  
  if (n - 0x7fffff00 < 0xffffffff80000101) {
    pvVar4 = (void *)0x0;
  }
  else {
    if (sqlite3Config.bMemstat == 0) {
      pvVar4 = (*sqlite3Config.m.xMalloc)((int)n);
      return pvVar4;
    }
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    iVar3 = (*sqlite3Config.m.xRoundup)((int)n);
    if (sqlite3Stat.mxValue[5] < (long)n) {
      sqlite3Stat.mxValue[5] = n;
    }
    if (0 < mem0.alarmThreshold) {
      if (sqlite3Stat.nowValue[0] < mem0.alarmThreshold - iVar3) {
        mem0.nearlyFull = 0;
      }
      else {
        mem0.nearlyFull = 1;
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
        }
        if (mem0.mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
        }
      }
    }
    pvVar4 = (*sqlite3Config.m.xMalloc)(iVar3);
    if (pvVar4 != (void *)0x0) {
      iVar3 = (*sqlite3Config.m.xSize)(pvVar4);
      sqlite3Stat.nowValue[0] = iVar3 + sqlite3Stat.nowValue[0];
      if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
        sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
      }
      lVar1 = sqlite3Stat.nowValue[9] + 1;
      bVar2 = sqlite3Stat.mxValue[9] <= sqlite3Stat.nowValue[9];
      sqlite3Stat.nowValue[9] = lVar1;
      if (bVar2) {
        sqlite3Stat.mxValue[9] = lVar1;
      }
    }
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    }
  }
  return pvVar4;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Malloc(u64 n){
  void *p;
  if( n==0 || n>=0x7fffff00 ){
    /* A memory allocation of a number of bytes which is near the maximum
    ** signed integer value might cause an integer overflow inside of the
    ** xMalloc().  Hence we limit the maximum size to 0x7fffff00, giving
    ** 255 bytes of overhead.  SQLite itself will never use anything near
    ** this amount.  The only way to reach the limit is with sqlite3_malloc() */
    p = 0;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    mallocWithAlarm((int)n, &p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    p = sqlite3GlobalConfig.m.xMalloc((int)n);
  }
  assert( EIGHT_BYTE_ALIGNMENT(p) );  /* IMP: R-11148-40995 */
  return p;
}